

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O0

__u32 get_cia_sample_point(__u32 bitrate)

{
  __u32 sampl_pt;
  __u32 bitrate_local;
  
  if (bitrate < 0xc3501) {
    if (bitrate < 0x7a121) {
      sampl_pt = 0x36b;
    }
    else {
      sampl_pt = 800;
    }
  }
  else {
    sampl_pt = 0x2ee;
  }
  return sampl_pt;
}

Assistant:

static __u32 get_cia_sample_point(__u32 bitrate)
{
	__u32 sampl_pt;

	if (bitrate > 800000)
		sampl_pt = 750;
	else if (bitrate > 500000)
		sampl_pt = 800;
	else
		sampl_pt = 875;

	return sampl_pt;
}